

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_node __thiscall pugi::xml_node::append_copy(xml_node *this,xml_node *proto)

{
  bool bVar1;
  xml_node_type child;
  xml_node_type parent;
  xml_node_struct *p;
  xml_allocator *in_RSI;
  xml_node *in_RDI;
  xml_node n;
  xml_allocator *alloc;
  xml_node_type type_;
  xml_node local_30;
  xml_allocator *local_28;
  xml_node local_8;
  
  child = type((xml_node *)in_RSI);
  parent = type(in_RDI);
  bVar1 = impl::anon_unknown_0::allow_insert_child(parent,child);
  if (bVar1) {
    local_28 = impl::anon_unknown_0::get_allocator<pugi::xml_node_struct>(in_RDI->_root);
    bVar1 = impl::anon_unknown_0::xml_allocator::reserve(local_28);
    if (bVar1) {
      p = impl::anon_unknown_0::allocate_node(in_RSI,child);
      xml_node(&local_30,p);
      bVar1 = operator!(&local_30);
      if (bVar1) {
        xml_node(&local_8);
      }
      else {
        impl::anon_unknown_0::append_node(local_30._root,in_RDI->_root);
        impl::anon_unknown_0::node_copy_tree((xml_node_struct *)alloc,n._root);
        local_8._root = local_30._root;
      }
    }
    else {
      xml_node(&local_8);
    }
  }
  else {
    xml_node(&local_8);
  }
  return (xml_node)local_8._root;
}

Assistant:

PUGI__FN xml_node xml_node::append_copy(const xml_node& proto)
	{
		xml_node_type type_ = proto.type();
		if (!impl::allow_insert_child(type(), type_)) return xml_node();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_node();

		xml_node n(impl::allocate_node(alloc, type_));
		if (!n) return xml_node();

		impl::append_node(n._root, _root);
		impl::node_copy_tree(n._root, proto._root);

		return n;
	}